

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall tinyusdz::crate::CrateReader::ReadFields(CrateReader *this)

{
  vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_> *this_00;
  byte bVar1;
  pointer pSVar2;
  StreamReader *pSVar3;
  uint64_t uVar4;
  bool bVar5;
  long *plVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  ulong uVar9;
  size_t sVar10;
  long *plVar11;
  pointer *ppcVar12;
  ValueRep *pVVar13;
  long lVar14;
  pointer pFVar15;
  ulong *puVar16;
  int iVar17;
  char *pcVar18;
  ulong *puVar19;
  pointer puVar20;
  pointer *ppcVar21;
  uint uVar22;
  size_t nbytes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  uint64_t num_fields;
  vector<unsigned_long,_std::allocator<unsigned_long>_> reps_data;
  uint64_t reps_size;
  string __str_1;
  string __str_2;
  string __str;
  ostringstream ss_e;
  long *local_2a8;
  undefined8 local_2a0;
  long local_298;
  undefined8 uStack_290;
  vector<char,_std::allocator<char>_> local_288;
  long lStack_270;
  ulong *local_268;
  long local_260;
  ulong local_258;
  long lStack_250;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_248;
  undefined8 uStack_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  pointer *local_1e8;
  long local_1e0;
  pointer local_1d8 [2];
  pointer *local_1c8 [2];
  pointer local_1b8 [2];
  optional<tinyusdz::Token> local_1a8 [2];
  ios_base local_138 [264];
  
  lVar14 = this->_fields_index;
  if ((lVar14 < 0) ||
     (pSVar2 = (this->_toc).sections.
               super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(this->_toc).sections.
           super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>.
           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 5 <= lVar14))
  goto LAB_001d76f3;
  if ((this->_version[0] != '\0') || (3 < this->_version[1])) {
    if (pSVar2[lVar14].size == 0) {
      return true;
    }
    pSVar3 = this->_sr;
    if (pSVar3->length_ < (ulong)pSVar2[lVar14].start) {
LAB_001d76f3:
      ::std::__cxx11::string::append((char *)&this->_err);
      return false;
    }
    pSVar3->idx_ = pSVar2[lVar14].start;
    bVar5 = StreamReader::read8(pSVar3,(uint64_t *)&local_268);
    if (!bVar5) goto LAB_001d76f3;
    if (local_268 == (ulong *)0x0) {
      return true;
    }
    if ((ulong *)(this->_config).maxNumFields < local_268) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadFields",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x163f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      pcVar18 = "Too many fields in `FIELDS` section.";
      lVar14 = 0x24;
      goto LAB_001d7e31;
    }
    uVar9 = (long)local_268 * 0x10 + this->_memoryUsage;
    this->_memoryUsage = uVar9;
    if ((this->_config).maxMemoryBudget < uVar9) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadFields",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      iVar17 = 0x1649;
    }
    else {
      this_00 = &this->_fields;
      ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::resize
                (this_00,(size_type)local_268);
      uVar9 = (long)local_268 * 4 + this->_memoryUsage;
      this->_memoryUsage = uVar9;
      if ((this->_config).maxMemoryBudget < uVar9) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadFields",10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        iVar17 = 0x1650;
      }
      else {
        local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_288,
                   (size_type)local_268);
        bVar5 = ReadCompressedInts<unsigned_int>
                          (this,(uint *)local_288.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start,(size_t)local_268);
        if (bVar5) {
          if (local_268 != (ulong *)0x0) {
            pFVar15 = (this_00->
                      super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            puVar19 = (ulong *)0x0;
            do {
              (pFVar15->token_index).super_Index.value =
                   *(uint32_t *)
                    ((long)local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start + (long)puVar19 * 4);
              puVar19 = (ulong *)((long)puVar19 + 1);
              pFVar15 = pFVar15 + 1;
            } while (local_268 != puVar19);
          }
          if (this->_memoryUsage < (ulong)((long)local_268 * 4)) {
            this->_memoryUsage = this->_memoryUsage + (long)local_268 * -4;
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadFields",10)
          ;
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1655);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Failed to read Field token_index array.",0x27);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2a8);
          if (local_2a8 != &local_298) {
            operator_delete(local_2a8,local_298 + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
        }
        if ((pointer *)
            local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (!bVar5) {
          return false;
        }
        bVar5 = StreamReader::read8(this->_sr,(uint64_t *)&local_228);
        if (!bVar5) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadFields",10)
          ;
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1664);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          pcVar18 = "Failed to read value reps legnth at `FIELDS` section.";
          lVar14 = 0x35;
          goto LAB_001d7e31;
        }
        if ((long *)pSVar2[lVar14].size < local_228) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadFields",10)
          ;
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1668);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          pcVar18 = "Invalid byte size of Value reps data.";
          lVar14 = 0x25;
          goto LAB_001d7e31;
        }
        if ((long *)this->_sr->length_ < local_228) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadFields",10)
          ;
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x166c);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          pcVar18 = "Compressed Value reps size exceeds USDC data.";
          lVar14 = 0x2d;
          goto LAB_001d7e31;
        }
        uVar9 = this->_memoryUsage + (long)local_228;
        this->_memoryUsage = uVar9;
        if (uVar9 <= (this->_config).maxMemoryBudget) {
          ::std::vector<char,_std::allocator<char>_>::vector
                    (&local_288,(size_type)local_228,(allocator_type *)local_1a8);
          plVar6 = local_228;
          pSVar3 = this->_sr;
          uVar4 = pSVar3->idx_;
          plVar11 = (long *)(pSVar3->length_ - uVar4);
          if (uVar4 + (long)local_228 <= pSVar3->length_) {
            plVar11 = local_228;
          }
          if ((long *)((long)plVar11 - 1U) < local_228) {
            memcpy(local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,pSVar3->binary_ + uVar4,(size_t)plVar11);
            pSVar3->idx_ = pSVar3->idx_ + (long)plVar11;
          }
          else {
            plVar11 = (long *)0x0;
          }
          puVar19 = local_268;
          if (plVar6 == plVar11) {
            plVar6 = (long *)((long)local_268 * 8);
            uVar9 = this->_memoryUsage + (long)plVar6;
            this->_memoryUsage = uVar9;
            if (uVar9 <= (this->_config).maxMemoryBudget) {
              local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                        (&local_248,(size_type)local_268);
              sVar10 = LZ4Compression::DecompressFromBuffer
                                 (local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (char *)local_248.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                  (size_t)local_228,(size_t)plVar6,&this->_err);
              if ((long)plVar6 - sVar10 == 0) {
                if (local_268 != (ulong *)0x0) {
                  pVVar13 = &((this_00->
                              super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                              )._M_impl.super__Vector_impl_data._M_start)->value_rep;
                  puVar16 = (ulong *)0x0;
                  do {
                    pVVar13->data =
                         local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)puVar16];
                    puVar16 = (ulong *)((long)puVar16 + 1);
                    pVVar13 = pVVar13 + 2;
                  } while (puVar16 < local_268);
                }
                plVar11 = (long *)this->_memoryUsage;
                if (plVar11 < plVar6) {
                  this->_memoryUsage = (uint64_t)(plVar11 + -(long)puVar19);
                  plVar11 = plVar11 + -(long)puVar19;
                }
                if (plVar11 < local_228) {
                  this->_memoryUsage = (long)plVar11 - (long)local_228;
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"[Crate]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ReadFields",10);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1686);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Failed to read Fields ValueRep data.",0x24);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2a8);
                if (local_2a8 != &local_298) {
                  operator_delete(local_2a8,local_298 + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                ::std::ios_base::~ios_base(local_138);
              }
              if (local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_248.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_248.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_248.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((pointer *)
                  local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer *)0x0) {
                operator_delete(local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_288.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_288.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if ((long)plVar6 - sVar10 != 0) {
                return false;
              }
              if (local_268 != (ulong *)0x0) {
                lVar14 = 0;
                puVar19 = (ulong *)0x0;
                do {
                  GetToken(local_1a8,this,
                           (Index)*(uint32_t *)
                                   ((long)&(((this->_fields).
                                             super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->token_index
                                           ).super_Index.value + lVar14));
                  if (((ostringstream)local_1a8[0].has_value_ == (ostringstream)0x1) &&
                     (local_1a8[0].contained.data.__align != (long)&local_1a8[0].contained + 0x10U))
                  {
                    operator_delete((void *)local_1a8[0].contained._0_8_,
                                    local_1a8[0].contained._16_8_ + 1);
                  }
                  puVar19 = (ulong *)((long)puVar19 + 1);
                  lVar14 = lVar14 + 0x10;
                } while (puVar19 < local_268);
                return true;
              }
              return true;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReadFields",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x167c);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            pcVar18 = "Reached to max memory budget.";
            lVar14 = 0x1d;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReadFields",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1677);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            pcVar18 = "Failed to read reps data at `FIELDS` section.";
            lVar14 = 0x2d;
          }
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,lVar14);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2a8);
          if (local_2a8 != &local_298) {
            operator_delete(local_2a8,local_298 + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          if ((pointer *)
              local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer *)0x0) {
            return false;
          }
          local_1b8[0] = (pointer)((long)local_288.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_288.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
          ppcVar21 = (pointer *)
                     local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
          goto LAB_001d7c84;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadFields",10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        iVar17 = 0x166f;
      }
    }
    poVar7 = (ostream *)::std::ostream::operator<<(local_1a8,iVar17);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    pcVar18 = "Reached to max memory budget.";
    lVar14 = 0x1d;
LAB_001d7e31:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,lVar14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2a8);
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base(local_138);
    return false;
  }
  local_1c8[0] = local_1b8;
  ::std::__cxx11::string::_M_construct((ulong)local_1c8,'\x01');
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1c8[0],1,0);
  plVar6 = (long *)::std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x3d9360);
  local_228 = &local_218;
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_218 = *plVar11;
    lStack_210 = plVar6[3];
  }
  else {
    local_218 = *plVar11;
    local_228 = (long *)*plVar6;
  }
  local_220 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_228);
  puVar19 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar19) {
    local_258 = *puVar19;
    lStack_250 = plVar6[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *puVar19;
    local_268 = (ulong *)*plVar6;
  }
  local_260 = plVar6[1];
  *plVar6 = (long)puVar19;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  bVar1 = this->_version[1];
  uVar22 = 1;
  if (9 < bVar1) {
    uVar22 = 3 - (bVar1 < 100);
  }
  local_208 = local_1f8;
  ::std::__cxx11::string::_M_construct((ulong)&local_208,(char)uVar22);
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_208,uVar22,(uint)bVar1);
  uVar9 = 0xf;
  if (local_268 != &local_258) {
    uVar9 = local_258;
  }
  if (uVar9 < (ulong)(local_200 + local_260)) {
    uVar9 = 0xf;
    if (local_208 != local_1f8) {
      uVar9 = local_1f8[0];
    }
    if (uVar9 < (ulong)(local_200 + local_260)) goto LAB_001d794e;
    puVar8 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_268);
  }
  else {
LAB_001d794e:
    puVar8 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_208);
  }
  local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  plVar6 = puVar8 + 2;
  if ((pointer *)*puVar8 == (pointer *)plVar6) {
    local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar6;
    uStack_230 = puVar8[3];
  }
  else {
    local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar6;
    local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*puVar8;
  }
  local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)puVar8[1];
  *puVar8 = plVar6;
  puVar8[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_248);
  ppcVar21 = &local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  ppcVar12 = (pointer *)(plVar6 + 2);
  if ((pointer *)*plVar6 == ppcVar12) {
    local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *ppcVar12;
    lStack_270 = plVar6[3];
    local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppcVar21;
  }
  else {
    local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *ppcVar12;
    local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*plVar6;
  }
  local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar6[1];
  *plVar6 = (long)ppcVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  bVar1 = this->_version[2];
  uVar22 = 1;
  if (9 < bVar1) {
    uVar22 = 3 - (bVar1 < 100);
  }
  local_1e8 = local_1d8;
  ::std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)uVar22);
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1e8,uVar22,(uint)bVar1);
  puVar20 = (pointer)0xf;
  if ((pointer *)
      local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != ppcVar21) {
    puVar20 = (pointer)local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  }
  if (puVar20 < local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish + local_1e0) {
    puVar20 = (pointer)0xf;
    if (local_1e8 != local_1d8) {
      puVar20 = local_1d8[0];
    }
    if (puVar20 < local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish + local_1e0) goto LAB_001d7a9d;
    puVar8 = (undefined8 *)
             ::std::__cxx11::string::replace
                       ((ulong)&local_1e8,0,(char *)0x0,
                        (ulong)local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start);
  }
  else {
LAB_001d7a9d:
    puVar8 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_1e8);
  }
  local_2a8 = &local_298;
  plVar6 = puVar8 + 2;
  if ((long *)*puVar8 == plVar6) {
    local_298 = *plVar6;
    uStack_290 = puVar8[3];
  }
  else {
    local_298 = *plVar6;
    local_2a8 = (long *)*puVar8;
  }
  local_2a0 = puVar8[1];
  *puVar8 = plVar6;
  puVar8[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_2a8);
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_1a8[0].contained._8_8_ = *plVar11;
    local_1a8[0].contained._16_8_ = plVar6[3];
    local_1a8[0]._0_8_ = (long)local_1a8 + 0x10U;
  }
  else {
    local_1a8[0].contained._8_8_ = *plVar11;
    local_1a8[0]._0_8_ = (long *)*plVar6;
  }
  local_1a8[0].contained._0_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar6 + 1);
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)&this->_err,local_1a8[0]._0_8_);
  if (local_1a8[0]._0_8_ != (long)local_1a8 + 0x10U) {
    operator_delete((void *)local_1a8[0]._0_8_,local_1a8[0].contained._8_8_ + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,(ulong)((long)local_1d8[0] + 1));
  }
  if ((pointer *)
      local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != ppcVar21) {
    operator_delete(local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 1));
  }
  if ((pointer *)
      local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if (local_1c8[0] == local_1b8) {
    return false;
  }
  local_1b8[0] = local_1b8[0] + 1;
  ppcVar21 = local_1c8[0];
LAB_001d7c84:
  operator_delete(ppcVar21,(ulong)local_1b8[0]);
  return false;
}

Assistant:

bool CrateReader::ReadFields() {
  if ((_fields_index < 0) || (_fields_index >= int64_t(_toc.sections.size()))) {
    _err += "Invalid index for `FIELDS` section.\n";
    return false;
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    _err += "Version must be 0.4.0 or later, but got " +
            std::to_string(_version[0]) + "." + std::to_string(_version[1]) +
            "." + std::to_string(_version[2]) + "\n";
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_fields_index)];

  if (s.size == 0) {
    // accepts Empty FIELDS size.
    return true;
  }

  if (!_sr->seek_set(uint64_t(s.start))) {
    _err += "Failed to move to `FIELDS` section.\n";
    return false;
  }

  uint64_t num_fields;
  if (!_sr->read8(&num_fields)) {
    _err += "Failed to read # of fields at `FIELDS` section.\n";
    return false;
  }

  DCOUT("num_fields = " << num_fields);

  if (num_fields == 0) {
    // Fields may be empty, so OK
    return true;
  }

  if (num_fields > _config.maxNumFields) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many fields in `FIELDS` section.");
  }

  if (sizeof(void *) == 4) {
    // 32bit
    if (num_fields > std::numeric_limits<int32_t>::max() / sizeof(uint32_t)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many fields in `FIELDS` section.");
    }
  }

  CHECK_MEMORY_USAGE(size_t(num_fields) * sizeof(Field));

  _fields.resize(static_cast<size_t>(num_fields));

  // indices
  {

    CHECK_MEMORY_USAGE(size_t(num_fields) * sizeof(uint32_t));

    std::vector<uint32_t> tmp;
    tmp.resize(size_t(num_fields));
    if (!ReadCompressedInts(tmp.data(), size_t(num_fields))) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read Field token_index array.");
    }

    for (size_t i = 0; i < num_fields; i++) {
      _fields[i].token_index.value = tmp[i];
    }

    REDUCE_MEMORY_USAGE(size_t(num_fields) * sizeof(uint32_t));

  }

  // Value reps(LZ4 compressed)
  {
    uint64_t reps_size; // compressed size
    if (!_sr->read8(&reps_size)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read value reps legnth at `FIELDS` section.");
    }

    if (reps_size > size_t(s.size)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid byte size of Value reps data.");
    }

    if (reps_size > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Compressed Value reps size exceeds USDC data.");
    }

    CHECK_MEMORY_USAGE(size_t(reps_size));

    // TODO: Decompress from _sr directly.
    std::vector<char> comp_buffer(static_cast<size_t>(reps_size));

    if (reps_size !=
        _sr->read(size_t(reps_size), size_t(reps_size),
                  reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read reps data at `FIELDS` section.");
    }

    // reps datasize = LZ4 compressed. uncompressed size = num_fields * 8 bytes
    size_t uncompressed_size = size_t(num_fields) * sizeof(uint64_t);
    CHECK_MEMORY_USAGE(uncompressed_size);

    std::vector<uint64_t> reps_data;
    reps_data.resize(static_cast<size_t>(num_fields));


    if (uncompressed_size != LZ4Compression::DecompressFromBuffer(
                                 comp_buffer.data(),
                                 reinterpret_cast<char *>(reps_data.data()),
                                 size_t(reps_size), uncompressed_size, &_err)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read Fields ValueRep data.");
    }

    for (size_t i = 0; i < num_fields; i++) {
      _fields[i].value_rep = crate::ValueRep(reps_data[i]);
    }

    REDUCE_MEMORY_USAGE(uncompressed_size);
    REDUCE_MEMORY_USAGE(size_t(reps_size)); // comp_buffer
  }

  DCOUT("num_fields = " << num_fields);
  for (size_t i = 0; i < num_fields; i++) {
    if (auto tokv = GetToken(_fields[i].token_index)) {
      DCOUT("field[" << i << "] name = " << tokv.value()
                     << ", value = " << _fields[i].value_rep.GetStringRepr());
    }
  }

  return true;
}